

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall Rml::Context::SetDimensions(Context *this,Vector2i _dimensions)

{
  ElementDocument *this_00;
  int iVar1;
  bool bVar2;
  int iVar3;
  pointer pEVar4;
  Element *this_01;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_98;
  ElementDocument *local_80;
  ElementDocument *document;
  int i;
  Vector2<float> local_68;
  Box local_60;
  Vector2i local_28;
  Vector2i local_20;
  Context *local_18;
  Context *this_local;
  Vector2i _dimensions_local;
  
  local_20 = _dimensions;
  local_18 = this;
  this_local = (Context *)_dimensions;
  bVar2 = Vector2<int>::operator!=(&this->dimensions,_dimensions);
  if (bVar2) {
    this->dimensions = (Vector2i)this_local;
    local_28 = this->dimensions;
    RenderManager::SetViewport(this->render_manager,local_28);
    pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(&this->root);
    local_68 = Vector2::operator_cast_to_Vector2((Vector2 *)&this->dimensions);
    Box::Box(&local_60,local_68);
    Element::SetBox(pEVar4,&local_60);
    Box::~Box(&local_60);
    pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(&this->root);
    (*(pEVar4->super_ScriptInterface).super_Releasable._vptr_Releasable[0x15])();
    document._0_4_ = 0;
    while( true ) {
      iVar1 = (int)document;
      pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                         (&this->root);
      iVar3 = Element::GetNumChildren(pEVar4,false);
      if (iVar3 <= iVar1) break;
      pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                         (&this->root);
      this_01 = Element::GetChild(pEVar4,(int)document);
      local_80 = Element::GetOwnerDocument(this_01);
      if (local_80 != (ElementDocument *)0x0) {
        ElementDocument::DirtyMediaQueries(local_80);
        ElementDocument::DirtyVwAndVhProperties(local_80);
        (*(local_80->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable[0x15])()
        ;
        ElementDocument::DirtyPosition(local_80);
        this_00 = local_80;
        local_98.m_container.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.m_container.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.m_container.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        itlib::
        flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
        ::flat_map(&local_98);
        Element::DispatchEvent(&this_00->super_Element,Resize,&local_98);
        itlib::
        flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
        ::~flat_map(&local_98);
      }
      document._0_4_ = (int)document + 1;
    }
  }
  return;
}

Assistant:

void Context::SetDimensions(const Vector2i _dimensions)
{
	if (dimensions != _dimensions)
	{
		dimensions = _dimensions;
		render_manager->SetViewport(dimensions);
		root->SetBox(Box(Vector2f(dimensions)));
		root->DirtyLayout();

		for (int i = 0; i < root->GetNumChildren(); ++i)
		{
			ElementDocument* document = root->GetChild(i)->GetOwnerDocument();
			if (document != nullptr)
			{
				document->DirtyMediaQueries();
				document->DirtyVwAndVhProperties();
				document->DirtyLayout();
				document->DirtyPosition();
				document->DispatchEvent(EventId::Resize, Dictionary());
			}
		}
	}
}